

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

void read_and_smooth3D(char *path,char *stem,float sigma,float (*floatpic) [512] [512],
                      uchar (*pic) [512] [512],uchar (*inpic) [512] [512],int start,int middle,
                      int end,uchar *header)

{
  int frame;
  ulong uVar1;
  long lVar2;
  float (*pafVar3) [512];
  ulong uVar4;
  float (*pafVar5) [512];
  uchar (*pauVar6) [512];
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int time;
  
  lVar2 = 0;
  pafVar3 = *floatpic;
  for (; lVar2 != 5; lVar2 = lVar2 + 1) {
    pafVar5 = pafVar3;
    for (lVar7 = 0; lVar7 != 0x200; lVar7 = lVar7 + 1) {
      for (lVar9 = 0; lVar9 != 0x200; lVar9 = lVar9 + 1) {
        (*(float (*) [512])*pafVar5)[lVar9] = 0.0;
      }
      pafVar5 = pafVar5 + 1;
    }
    pafVar3 = pafVar3 + 0x200;
  }
  pic_t = (end - start) + 1;
  readfiles(path,stem,inpic,sigma,pic_t,&pic_x,&pic_y,start,end,header);
  if ((sigma == 0.0) && (!NAN(sigma))) {
    uVar1 = (ulong)(uint)pic_x;
    if (pic_x < 1) {
      uVar1 = 0;
    }
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      uVar4 = (ulong)(uint)pic_y;
      if (pic_y < 1) {
        uVar4 = 0;
      }
      uVar8 = 0;
      pafVar3 = *floatpic;
      pauVar6 = *inpic;
      for (; uVar8 != uVar1; uVar8 = uVar8 + 1) {
        for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
          (*(float (*) [512])*pafVar3)[uVar10] = (float)(*(uchar (*) [512])*pauVar6)[uVar10];
        }
        pauVar6 = pauVar6 + 1;
        pafVar3 = pafVar3 + 1;
      }
      inpic = (uchar (*) [512] [512])((long)inpic + 0x40000);
      floatpic = (float (*) [512] [512])((long)floatpic + 0x100000);
    }
    return;
  }
  printf("Number of columns: %d Number of rows: %d\n",(ulong)(uint)pic_y,(ulong)(uint)pic_x);
  if ((pic_x < 0x201) && (pic_y < 0x201)) {
    fflush(_stdout);
    if (OUTPUT_SMOOTH != 0) {
      printf("Start: %d End: %d Middle: %d\n",(ulong)(uint)start,(ulong)(uint)end,
             (ulong)(uint)middle);
    }
    time = 0;
    while( true ) {
      frame = time + middle + -2;
      if (middle + 2 < frame) break;
      convolve_Gaussian(inpic,floatpic,pic,sigma,pic_t,pic_x,pic_y,start,frame,time);
      time = time + 1;
    }
    puts("Input files smoothed");
    return;
  }
  puts("Fatal error: images are too big");
  exit(1);
}

Assistant:

void read_and_smooth3D(char path[], char stem[],
float sigma, float floatpic[][PIC_X][PIC_Y],
 unsigned char pic[][PIC_X][PIC_Y],
unsigned char inpic[][PIC_X][PIC_Y],
int start, int middle, int end,
unsigned char header[])
{
int i,j,k,time,frame;

for(k=0;k<FIVE;k++)
for(i=0;i<PIC_X;i++)
for(j=0;j<PIC_Y;j++)
	floatpic[k][i][j] = 0.0;

pic_t = end-start+1;


readfiles(path,stem,inpic,sigma,pic_t,&pic_x,&pic_y,start,end,header);
if(sigma==0.0)
	{
	for(k=0;k<FIVE;k++)
	for(i=0;i<pic_x;i++)
	for(j=0;j<pic_y;j++)
		floatpic[k][i][j] = inpic[k][i][j];
	return;
	}

printf("Number of columns: %d Number of rows: %d\n",pic_y,pic_x);
if(pic_x > PIC_X || pic_y > PIC_Y)
	{
	printf("Fatal error: images are too big\n");
	exit(1);
	}
fflush(stdout);

time = -1;
frame = middle-2;
if(OUTPUT_SMOOTH) printf("Start: %d End: %d Middle: %d\n",start,end,middle);
for(frame=middle-2;frame<=middle+2;frame++)
	{
	time++;
	convolve_Gaussian(inpic,floatpic,pic,sigma,pic_t,pic_x,pic_y,
		start,middle-2+time,time);
	}
printf("Input files smoothed\n");
}